

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O0

double sisl::basis_function::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                 (vector *p,cartesian_cubic<float> *lattice,double *h)

{
  Index *this;
  bool bVar1;
  int iVar2;
  reference other;
  undefined4 extraout_var;
  double dVar3;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_1a8;
  Matrix<int,__1,_1,_0,__1,_1> local_190;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_180;
  Type local_168;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
  local_140;
  vector local_108;
  double local_f8;
  double w;
  Matrix<int,__1,_1,_0,__1,_1> local_d8;
  undefined4 local_c4;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_c0;
  Matrix<int,__1,_1,_0,__1,_1> local_a8;
  undefined1 local_98 [8];
  lattice_site s;
  iterator __end0;
  iterator __begin0;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *__range2;
  double value;
  lattice_site extent;
  undefined1 local_48 [8];
  lattice_site c;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  double *h_local;
  cartesian_cubic<float> *lattice_local;
  vector *p_local;
  
  tp_linear::get_integer_support<3>();
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0xe])(local_48,lattice,p);
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[10])(&value);
  __range2 = (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)0x0;
  this = &c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  __end0 = std::
           vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
           ::begin((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                    *)this);
  s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)std::
              vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
              ::end((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                     *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_*,_std::vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                                     *)&s.
                                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                        m_storage.m_rows), bVar1) {
    other = __gnu_cxx::
            __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
            ::operator*(&__end0);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_98,other);
    Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
              (&local_c0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
               (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
    Eigen::Matrix<int,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
              ((Matrix<int,_1,1,0,_1,1> *)&local_a8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_c0);
    iVar2 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x11])(lattice,&local_a8);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_a8);
    if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&w,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_d8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&w);
      iVar2 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x14])(lattice,&local_d8);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_d8);
      if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
        Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                  (&local_180,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                   (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
        Eigen::
        DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
        ::cast<double>(&local_168,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)&local_180);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  (&local_140,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)p,
                   (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_168);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_108,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                    *)&local_140);
        dVar3 = tp_linear::phi<3>(h,&local_108);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_108);
        local_f8 = dVar3;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                    (&local_1a8,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_48,
                     (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_98);
          Eigen::Matrix<int,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                    ((Matrix<int,_1,1,0,_1,1> *)&local_190,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      *)&local_1a8);
          iVar2 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[5])(lattice,&local_190);
          __range2 = (vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      *)(dVar3 * (double)*(float *)CONCAT44(extraout_var,iVar2) + (double)__range2);
          Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_190);
          local_c4 = 0;
        }
        else {
          local_c4 = 3;
        }
      }
      else {
        local_c4 = 3;
      }
    }
    else {
      local_c4 = 3;
    }
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_98);
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
    ::operator++(&__end0);
  }
  local_c4 = 1;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&value);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_48);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             *)&c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  return (double)__range2;
}

Assistant:

static double convolution_sum_h(const vector &p, const L *lattice, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = lattice->get_nearest_site(p);
            lattice_site extent = lattice->get_dimensions();

            double value = 0;

            for(lattice_site s : sites) {

                if(!lattice->is_lattice_site(c+s)) continue;
                if(!lattice->is_filled(c+s)) continue;


                double w = BF::template phi<N>(h, p - (c+s).cast<double>());
                if(w == 0.) continue;
                value += w * (*lattice)(c + s);
            }
            return value;
        }